

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

QList<int> * __thiscall
QHash<int,_QList<int>_>::value
          (QList<int> *__return_storage_ptr__,QHash<int,_QList<int>_> *this,int *key)

{
  QArrayDataPointer<int> *other;
  
  other = &valueImpl<int>(this,key)->d;
  if (other == (QArrayDataPointer<int> *)0x0) {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (int *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    QArrayDataPointer<int>::QArrayDataPointer(&__return_storage_ptr__->d,other);
  }
  return __return_storage_ptr__;
}

Assistant:

T value(const Key &key) const noexcept
    {
        if (T *v = valueImpl(key))
            return *v;
        else
            return T();
    }